

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::Parser::ParseImport
          (Parser *this,
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *dependency,RepeatedField<int> *public_dependency,RepeatedField<int> *weak_dependency,
          LocationRecorder *root_location)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  string *output;
  int iVar4;
  LocationRecorder location;
  LocationRecorder local_40;
  
  bVar1 = Consume(this,"import");
  if (!bVar1) {
    return false;
  }
  iVar2 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
  if (iVar2 == 0) {
    iVar2 = public_dependency->current_size_;
    LocationRecorder::Init(&local_40,root_location);
    LocationRecorder::AddPath(&local_40,10);
    LocationRecorder::AddPath(&local_40,iVar2);
    bVar1 = Consume(this,"public");
    if (!bVar1) {
LAB_00215dc5:
      LocationRecorder::~LocationRecorder(&local_40);
      return false;
    }
    iVar2 = (dependency->super_RepeatedPtrFieldBase).current_size_;
    iVar4 = public_dependency->current_size_;
    if (iVar4 == public_dependency->total_size_) {
      RepeatedField<int>::Reserve(public_dependency,iVar4 + 1);
      iVar4 = public_dependency->current_size_;
    }
    piVar3 = public_dependency->elements_;
    public_dependency->current_size_ = iVar4 + 1;
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
    if (iVar2 != 0) goto LAB_00215d00;
    iVar2 = weak_dependency->current_size_;
    LocationRecorder::Init(&local_40,root_location);
    LocationRecorder::AddPath(&local_40,0xb);
    LocationRecorder::AddPath(&local_40,iVar2);
    bVar1 = Consume(this,"weak");
    if (!bVar1) goto LAB_00215dc5;
    iVar2 = (dependency->super_RepeatedPtrFieldBase).current_size_;
    iVar4 = weak_dependency->current_size_;
    if (iVar4 == weak_dependency->total_size_) {
      RepeatedField<int>::Reserve(weak_dependency,iVar4 + 1);
      iVar4 = weak_dependency->current_size_;
    }
    piVar3 = weak_dependency->elements_;
    weak_dependency->current_size_ = iVar4 + 1;
  }
  piVar3[iVar4] = iVar2;
  LocationRecorder::~LocationRecorder(&local_40);
LAB_00215d00:
  iVar2 = (dependency->super_RepeatedPtrFieldBase).current_size_;
  LocationRecorder::Init(&local_40,root_location);
  LocationRecorder::AddPath(&local_40,3);
  LocationRecorder::AddPath(&local_40,iVar2);
  iVar2 = (dependency->super_RepeatedPtrFieldBase).current_size_;
  iVar4 = (dependency->super_RepeatedPtrFieldBase).allocated_size_;
  if (iVar2 < iVar4) {
    (dependency->super_RepeatedPtrFieldBase).current_size_ = iVar2 + 1;
    output = (string *)(dependency->super_RepeatedPtrFieldBase).elements_[iVar2];
  }
  else {
    if (iVar4 == (dependency->super_RepeatedPtrFieldBase).total_size_) {
      internal::RepeatedPtrFieldBase::Reserve(&dependency->super_RepeatedPtrFieldBase,iVar4 + 1);
      iVar4 = (dependency->super_RepeatedPtrFieldBase).allocated_size_;
    }
    (dependency->super_RepeatedPtrFieldBase).allocated_size_ = iVar4 + 1;
    output = internal::StringTypeHandlerBase::New_abi_cxx11_();
    iVar2 = (dependency->super_RepeatedPtrFieldBase).current_size_;
    (dependency->super_RepeatedPtrFieldBase).current_size_ = iVar2 + 1;
    (dependency->super_RepeatedPtrFieldBase).elements_[iVar2] = output;
  }
  bVar1 = ConsumeString(this,output,"Expected a string naming the file to import.");
  if (bVar1) {
    LocationRecorder::EndAt(&local_40,&this->input_->previous_);
    bVar1 = ConsumeEndOfDeclaration(this,";",&local_40);
  }
  else {
    bVar1 = false;
  }
  LocationRecorder::~LocationRecorder(&local_40);
  return bVar1;
}

Assistant:

bool Parser::ParseImport(RepeatedPtrField<string>* dependency,
                         RepeatedField<int32>* public_dependency,
                         RepeatedField<int32>* weak_dependency,
                         const LocationRecorder& root_location) {
  DO(Consume("import"));
  if (LookingAt("public")) {
    LocationRecorder location(
        root_location, FileDescriptorProto::kPublicDependencyFieldNumber,
        public_dependency->size());
    DO(Consume("public"));
    *public_dependency->Add() = dependency->size();
  } else if (LookingAt("weak")) {
    LocationRecorder location(
        root_location, FileDescriptorProto::kWeakDependencyFieldNumber,
        weak_dependency->size());
    DO(Consume("weak"));
    *weak_dependency->Add() = dependency->size();
  }
  {
    LocationRecorder location(root_location,
                              FileDescriptorProto::kDependencyFieldNumber,
                              dependency->size());
    DO(ConsumeString(dependency->Add(),
      "Expected a string naming the file to import."));

    location.EndAt(input_->previous());

    DO(ConsumeEndOfDeclaration(";", &location));
  }
  return true;
}